

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.cpp
# Opt level: O2

void __thiscall OpenNN::NeuralNetwork::print_network(NeuralNetwork *this)

{
  int iVar1;
  ostream *poVar2;
  reference ppLVar3;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *m;
  reference ppMVar4;
  int iVar5;
  ulong uVar6;
  size_type __n;
  MatrixXd weight_matrix;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  uVar6 = (ulong)((long)(this->network_layers).
                        super__Vector_base<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->network_layers).
                       super__Vector_base<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>._M_impl
                       .super__Vector_impl_data._M_start) >> 3;
  iVar1 = (int)uVar6;
  __n = 0;
  uVar6 = uVar6 & 0xffffffff;
  if (iVar1 < 1) {
    uVar6 = __n;
  }
  while (uVar6 != __n) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Values for layer ");
    iVar5 = (int)(__n + 1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar5);
    std::endl<char,std::char_traits<char>>(poVar2);
    ppLVar3 = std::vector<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>::at
                        (&this->network_layers,__n);
    m = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Layer::to_matrix(*ppLVar3);
    poVar2 = Eigen::operator<<((ostream *)&std::cout,m);
    std::endl<char,std::char_traits<char>>(poVar2);
    if (iVar1 - 1 != __n) {
      ppMVar4 = std::
                vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>_>
                ::at(&this->weight_matrices,__n);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)*ppMVar4);
      poVar2 = std::operator<<((ostream *)&std::cout,"Weight matrix for layer ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar5);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_48);
      std::endl<char,std::char_traits<char>>(poVar2);
      free(local_48.m_data);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"____________________");
    std::endl<char,std::char_traits<char>>(poVar2);
    __n = __n + 1;
  }
  return;
}

Assistant:

void OpenNN::NeuralNetwork::print_network()
{
    int layer_count = this->network_layers.size();
    for (int i = 0; i < layer_count; i++)
    {
        std::cout << "Values for layer " << (i + 1) << std::endl;
        Layer* layer = this->network_layers.at(i);
        std::cout << *layer->to_matrix() << std::endl;
        if (i != (layer_count - 1)) {
            Eigen::MatrixXd weight_matrix = *this->weight_matrices.at(i);
            std::cout << "Weight matrix for layer " << (i+1) << std::endl;
            std::cout << weight_matrix << std::endl;
        }
        std::cout << "____________________" << std::endl;
    }
}